

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O1

int envy_bios_parse_rdcb(envy_bios *bios)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  
  uVar9 = (bios->dcb).offset - 1;
  uVar2 = bios->length;
  if (uVar9 < uVar2) {
    (bios->dcb).rdcb_version = bios->data[uVar9];
  }
  else {
    (bios->dcb).rdcb_version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
  }
  iVar4 = -0xe;
  if (uVar9 < uVar2) {
    bVar8 = (bios->dcb).rdcb_version - 0x11;
    if ((bVar8 < 7) && ((0x71U >> (bVar8 & 0x1f) & 1) != 0)) {
      (bios->dcb).rdcb_len = *(uint16_t *)(&DAT_00271e24 + (ulong)bVar8 * 2);
      uVar1 = (bios->dcb).offset;
      uVar2 = uVar1 - 2;
      if (uVar2 < bios->length) {
        (bios->inputdev).offset = CONCAT11(bios->data[uVar2],bios->data[uVar1 - 3]);
        uVar2 = 0;
      }
      else {
        (bios->inputdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar2 = 0xfffffff2;
      }
      uVar9 = (bios->dcb).offset - 5;
      if (uVar9 < bios->length) {
        bVar8 = bios->data[uVar9];
        uVar9 = 0;
      }
      else {
        bVar8 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar9 = 0xfffffff2;
      }
      uVar3 = (bios->dcb).offset - 4;
      if (uVar3 < bios->length) {
        bVar5 = bios->data[uVar3];
        uVar3 = 0;
      }
      else {
        bVar5 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar3 = 0xfffffff2;
      }
      uVar3 = uVar9 | uVar2 | uVar3;
      (bios->dcb).tvdac0_present = bVar8 & 1;
      (bios->dcb).tvdac0_neg = bVar8 >> 1 & 1;
      (bios->dcb).tvdac0_line = bVar5 >> 4;
      (bios->dcb).rdcb_unk04_0 = bVar5 & 0xf;
      (bios->dcb).rdcb_unk05_2 = bVar8 >> 2;
      iVar7 = -6;
      lVar6 = 0x169;
      do {
        uVar2 = (uint)(bios->dcb).offset + iVar7;
        if (uVar2 < bios->length) {
          *(uint8_t *)((long)&bios->data + lVar6) = bios->data[uVar2];
          uVar2 = 0;
        }
        else {
          *(undefined1 *)((long)&bios->data + lVar6) = 0;
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          uVar2 = 0xfffffff2;
        }
        uVar3 = uVar3 | uVar2;
        iVar7 = iVar7 + -1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x170);
      if (0x14 < (bios->dcb).rdcb_version) {
        uVar2 = (bios->dcb).offset - 0xd;
        if (uVar2 < bios->length) {
          (bios->dcb).rdcb_unk0d = bios->data[uVar2];
          uVar2 = 0;
        }
        else {
          (bios->dcb).rdcb_unk0d = '\0';
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          uVar2 = 0xfffffff2;
        }
        uVar1 = (bios->dcb).offset;
        uVar9 = uVar1 - 0xe;
        if (uVar9 < bios->length) {
          (bios->gpio).offset = CONCAT11(bios->data[uVar9],bios->data[uVar1 - 0xf]);
          uVar9 = 0;
        }
        else {
          (bios->gpio).offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar9 = 0xfffffff2;
        }
        uVar3 = uVar3 | uVar2 | uVar9;
        iVar7 = -0x10;
        lVar6 = 0x171;
        do {
          uVar2 = (uint)(bios->dcb).offset + iVar7;
          if (uVar2 < bios->length) {
            *(uint8_t *)((long)&bios->data + lVar6) = bios->data[uVar2];
            uVar2 = 0;
          }
          else {
            *(undefined1 *)((long)&bios->data + lVar6) = 0;
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar2 = 0xfffffff2;
          }
          uVar3 = uVar3 | uVar2;
          iVar7 = iVar7 + -1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x17a);
      }
      if (0x16 < (bios->dcb).rdcb_version) {
        iVar7 = -0x19;
        lVar6 = 0x17a;
        do {
          uVar2 = (uint)(bios->dcb).offset + iVar7;
          if (uVar2 < bios->length) {
            *(uint8_t *)((long)&bios->data + lVar6) = bios->data[uVar2];
            uVar2 = 0;
          }
          else {
            *(undefined1 *)((long)&bios->data + lVar6) = 0;
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar2 = 0xfffffff2;
          }
          uVar3 = uVar3 | uVar2;
          iVar7 = iVar7 + -1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x17e);
      }
      if (uVar3 == 0) {
        uVar2 = (uint)(bios->dcb).rdcb_len;
        envy_bios_block(bios,(bios->dcb).offset - uVar2,uVar2,"RDCB",-1);
        if ((bios->dcb).rdcb_version < 0x16) {
          uVar2 = ((uint)(bios->dcb).offset - (uint)(bios->dcb).rdcb_len) - 0x80;
          bios->odcb_offset = uVar2;
          envy_bios_block(bios,uVar2,0x80,"ODCB",-1);
        }
        (bios->dcb).rdcb_valid = '\x01';
        iVar4 = 0;
      }
    }
    else {
      envy_bios_parse_rdcb_cold_1();
      iVar4 = -0x16;
    }
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_rdcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	int err = 0;
	err |= bios_u8(bios, dcb->offset - 1, &dcb->rdcb_version);
	if (err)
		return -EFAULT;
	switch (dcb->rdcb_version) {
		case 0x11:
			dcb->rdcb_len = 0xc;
			break;
		case 0x15:
		case 0x16:
			dcb->rdcb_len = 0x18;
			break;
		case 0x17:
			dcb->rdcb_len = 0x1c;
			break;
		default:
			ENVY_BIOS_ERR("Unknown RDCB table version %d.%d\n", dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
			return -EINVAL;
	}
	err |= bios_u16(bios, dcb->offset - 3, &bios->inputdev.offset);
	uint8_t tv0, tv1;
	int j;
	err |= bios_u8(bios, dcb->offset - 5, &tv0);
	err |= bios_u8(bios, dcb->offset - 4, &tv1);
	dcb->tvdac0_present = tv0 & 1;
	dcb->tvdac0_neg = tv0 >> 1 & 1;
	dcb->tvdac0_line = tv1 >> 4;
	dcb->rdcb_unk04_0 = tv1 & 0xf;
	dcb->rdcb_unk05_2 = tv0 >> 2;
	for (j = 0; j < 7; j++)
		err |= bios_u8(bios, dcb->offset - 6 - j, &dcb->rdcb_unk06[j]);
	if (dcb->rdcb_version >= 0x15) {
		err |= bios_u8(bios, dcb->offset - 13, &dcb->rdcb_unk0d);
		err |= bios_u16(bios, dcb->offset - 15, &bios->gpio.offset);
		for (j = 0; j < 9; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (dcb->rdcb_version >= 0x17) {
		for (j = 9; j < 13; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, "RDCB", -1);
	if (dcb->rdcb_version < 0x16) {
		bios->odcb_offset = dcb->offset - dcb->rdcb_len - 0x80;
		envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
	}
	dcb->rdcb_valid = 1;
	return 0;
}